

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O0

void __thiscall
de::cmdline::detail::Parser::addOption<tcu::opt::VKDeviceID>
          (Parser *this,Option<tcu::opt::VKDeviceID> *option)

{
  bool bVar1;
  byte local_71;
  undefined1 local_70 [8];
  OptInfo opt;
  Option<tcu::opt::VKDeviceID> *option_local;
  Parser *this_local;
  
  opt.setDefault = (SetDefaultFunc)option;
  OptInfo::OptInfo((OptInfo *)local_70);
  local_70 = *(undefined1 (*) [8])opt.setDefault;
  opt.shortName = *(char **)(opt.setDefault + 8);
  opt.longName = *(char **)(opt.setDefault + 0x10);
  opt.description = *(char **)(opt.setDefault + 0x18);
  bVar1 = isBooleanOpt<tcu::opt::VKDeviceID>();
  local_71 = 0;
  if (bVar1) {
    local_71 = *(long *)(opt.setDefault + 0x28) != 0 ^ 0xff;
  }
  opt.defaultValue._0_1_ = local_71 & 1;
  opt._32_8_ = *(undefined8 *)(opt.setDefault + 0x20);
  opt.parse = *(GenericParseFunc *)(opt.setDefault + 0x28);
  opt.namedValues = *(void **)(opt.setDefault + 0x30);
  opt.namedValuesEnd = (void *)0x10;
  opt.namedValueStride = (size_t)dispatchParse<tcu::opt::VKDeviceID>;
  if ((byte)opt.defaultValue != 0) {
    opt.dispatchParse = dispatchSetDefault<tcu::opt::VKDeviceID>;
  }
  addOption(this,(OptInfo *)local_70);
  return;
}

Assistant:

void Parser::addOption (const Option<OptType>& option)
{
	OptInfo opt;

	opt.shortName			= option.shortName;
	opt.longName			= option.longName;
	opt.description			= option.description;
	opt.defaultValue		= option.defaultValue;
	opt.isFlag				= isBooleanOpt<OptType>() && !option.namedValues;
	opt.parse				= (GenericParseFunc)option.parse;
	opt.namedValues			= (const void*)option.namedValues;
	opt.namedValuesEnd		= (const void*)option.namedValuesEnd;
	opt.namedValueStride	= sizeof(*option.namedValues);
	opt.dispatchParse		= dispatchParse<OptType>;

	if (opt.isFlag)
		opt.setDefault		= dispatchSetDefault<OptType>;

	addOption(opt);
}